

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LiteralComparators.hpp
# Opt level: O1

Comparison __thiscall
Kernel::LiteralComparators::
Composite<Kernel::LiteralComparators::NegativeEquality,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::MaximalSize,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::Negative,_Kernel::LiteralComparators::LexComparator>_>_>
::compare(Composite<Kernel::LiteralComparators::NegativeEquality,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::MaximalSize,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::Negative,_Kernel::LiteralComparators::LexComparator>_>_>
          *this,Literal *l1,Literal *l2)

{
  uint uVar1;
  uint uVar2;
  Comparison CVar3;
  byte bVar4;
  bool bVar5;
  
  bVar4 = 1;
  if ((l1->super_Term)._functor == 0) {
    bVar4 = ((byte)(l1->super_Term)._args[0]._content & 4) >> 2;
  }
  if ((l2->super_Term)._functor == 0) {
    bVar5 = ((l2->super_Term)._args[0]._content & 4) == 0;
  }
  else {
    bVar5 = false;
  }
  CVar3 = GREATER;
  if (bVar5 != false) {
    CVar3 = -(uint)(bVar4 & bVar5);
  }
  if (bVar4 != 0) {
    CVar3 = -(uint)(bVar4 & bVar5);
  }
  if (CVar3 == EQUAL) {
    uVar2 = (l1->super_Term)._weight;
    uVar1 = (l2->super_Term)._weight;
    CVar3 = LESS;
    if (uVar1 <= uVar2) {
      CVar3 = (uint)(uVar2 != uVar1);
    }
    if (CVar3 == EQUAL) {
      CVar3 = Composite<Kernel::LiteralComparators::Negative,_Kernel::LiteralComparators::LexComparator>
              ::compare(&(this->_c2)._c2,l1,l2);
      return CVar3;
    }
  }
  return CVar3;
}

Assistant:

Comparison compare(Literal* l1, Literal* l2)
  {
    Comparison res1=_c1.compare(l1,l2);
    return (res1==EQUAL)?_c2.compare(l1,l2):res1;
  }